

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O2

int run_script(uint script_id,uint numPar,uint32_t *param)

{
  int iVar1;
  gpioExtent_t ext [1];
  
  ext[0].size = (size_t)(numPar * 4);
  ext[0].ptr = param;
  iVar1 = pigpio_command_ext(gPigCommand,0x28,script_id,0,numPar * 4,1,ext,1);
  return iVar1;
}

Assistant:

int run_script(unsigned script_id, unsigned numPar, uint32_t *param)
{
   gpioExtent_t ext[1];

   /*
   p1=script id
   p2=0
   p3=numPar * 4
   ## extension ##
   uint32_t[numPar] pars
   */

   ext[0].size = 4 * numPar;
   ext[0].ptr = param;

   return pigpio_command_ext
      (gPigCommand, PI_CMD_PROCR, script_id, 0, numPar*4, 1, ext, 1);
}